

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledOutputFile::~TiledOutputFile(TiledOutputFile *this)

{
  pthread_mutex_t *__mutex;
  OStream *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  Data *this_00;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_001e4470;
  if (this->_data == (Data *)0x0) goto LAB_001a0f01;
  __mutex = (pthread_mutex_t *)this->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  iVar2 = (*this->_streamData->os->_vptr_OStream[3])();
  if (this->_data->tileOffsetsPosition != 0) {
    (*this->_streamData->os->_vptr_OStream[4])();
    TileOffsets::writeTo(&this->_data->tileOffsets,this->_streamData->os);
    pOVar1 = this->_streamData->os;
    (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar2));
  }
  pthread_mutex_unlock(__mutex);
  if (((this->_deleteStream == true) && (this->_streamData != (OutputStreamMutex *)0x0)) &&
     (pOVar1 = this->_streamData->os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
  }
  this_00 = this->_data;
  if (this_00->partNumber == -1) {
    operator_delete(this->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) goto LAB_001a0eec;
    this_00 = (Data *)0x0;
  }
  else {
LAB_001a0eec:
    Data::~Data(this_00);
  }
  operator_delete(this_00,0x178);
LAB_001a0f01:
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

TiledOutputFile::~TiledOutputFile ()
{
    if (_data)
    {
        {
#if ILMTHREAD_THREADING_ENABLED
            std::lock_guard<std::mutex> lock (*_streamData);
#endif
            uint64_t originalPosition = _streamData->os->tellp ();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _streamData->os->seekp (originalPosition);
                }
                catch (
                    ...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }

        if (_deleteStream && _streamData) delete _streamData->os;

        if (_data->partNumber == -1) delete _streamData;

        delete _data;
    }
}